

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_status(int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  sqlite3_int64 *in_RDX;
  sqlite3_int64 *in_RSI;
  long in_FS_OFFSET;
  int rc;
  sqlite3_int64 iHwtr;
  sqlite3_int64 iCur;
  int in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_status64(in_stack_ffffffffffffffe0,in_RSI,in_RDX,in_ECX);
  if (iVar2 == 0) {
    *(undefined4 *)in_RSI = 0;
    *(undefined4 *)in_RDX = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_status(int op, int *pCurrent, int *pHighwater, int resetFlag){
  sqlite3_int64 iCur = 0, iHwtr = 0;
  int rc;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  rc = sqlite3_status64(op, &iCur, &iHwtr, resetFlag);
  if( rc==0 ){
    *pCurrent = (int)iCur;
    *pHighwater = (int)iHwtr;
  }
  return rc;
}